

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O2

TRIPLEYCbCr **
gradationalTransformation(TRIPLEYCbCr **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo)

{
  int *piVar1;
  undefined1 auVar2 [16];
  int i;
  void *__s;
  void *pvVar3;
  TRIPLEYCbCr **ppTVar4;
  TRIPLEYCbCr *pTVar5;
  int j;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  __s = operator_new__(0x400);
  uVar11 = 0;
  memset(__s,0,0x400);
  uVar9 = 0;
  if (0 < (int)bmInfo.biWidth) {
    uVar9 = (ulong)bmInfo.biWidth;
  }
  uVar10 = 0;
  if (0 < (int)bmInfo.biHeight) {
    uVar10 = (ulong)bmInfo.biHeight;
  }
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    for (lVar6 = 0; uVar9 * 3 != lVar6; lVar6 = lVar6 + 3) {
      piVar1 = (int *)((long)__s + (ulong)(&mrx[uVar11]->Y)[lVar6] * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  pvVar3 = operator_new__(0x100);
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    iVar8 = 0;
    for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
      iVar8 = iVar8 + *(int *)((long)__s + lVar7 * 4);
    }
    *(char *)((long)pvVar3 + lVar6) =
         (char)(int)((double)iVar8 * (255.0 / (double)(int)(bmInfo.biWidth * bmInfo.biHeight)));
  }
  uVar11 = (long)(int)bmInfo.biHeight << 3;
  if ((int)bmInfo.biHeight < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  ppTVar4 = (TRIPLEYCbCr **)operator_new__(uVar11);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)bmInfo.biWidth;
  uVar11 = SUB168(auVar2 * ZEXT816(3),0);
  if (SUB168(auVar2 * ZEXT816(3),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
    pTVar5 = (TRIPLEYCbCr *)operator_new__(uVar11);
    ppTVar4[uVar12] = pTVar5;
    for (lVar6 = 0; uVar9 * 3 != lVar6; lVar6 = lVar6 + 3) {
      (&pTVar5->Y)[lVar6] = *(uchar *)((long)pvVar3 + (ulong)(&mrx[uVar12]->Y)[lVar6]);
    }
  }
  return ppTVar4;
}

Assistant:

TRIPLEYCbCr **gradationalTransformation(TRIPLEYCbCr **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo) {
    int *n = new int[256];
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    memset(n, 0, sizeof(int) * 256);
    for (int i = 0; i < h; i++) {
        for (int j = 0; j < w; j++) {
            n[mrx[i][j].Y]++;
        }
    }

    uint8_t *s = new uint8_t[256];
    for (int i = 0; i < 256; i++) {
        int sum = 0;
        for (int j = 0; j < i; j++) {
            sum += n[j];
        }
        s[i] = (uint8_t) (sum * ((double) 255 / (h * w)));
    }
    TRIPLEYCbCr **mrxGrad = new TRIPLEYCbCr *[h];
    for (int i = 0; i < h; i++) {
        mrxGrad[i] = new TRIPLEYCbCr[w];
        for (int j = 0; j < w; j++) {
            mrxGrad[i][j].Y = s[mrx[i][j].Y];
        }
    }
    return mrxGrad;
}